

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

bool __thiscall
Rml::DecoratorLinearGradient::Initialise
          (DecoratorLinearGradient *this,bool in_repeating,Corner in_corner,float in_angle,
          ColorStopList *in_color_stops)

{
  this->repeating = in_repeating;
  this->corner = in_corner;
  this->angle = in_angle;
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
            (&this->color_stops,in_color_stops);
  return (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool DecoratorLinearGradient::Initialise(bool in_repeating, Corner in_corner, float in_angle, const ColorStopList& in_color_stops)
{
	repeating = in_repeating;
	corner = in_corner;
	angle = in_angle;
	color_stops = in_color_stops;
	return !color_stops.empty();
}